

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

Vec_Int_t * Emb_ManDumpGnuplotPrepare(Emb_Man_t *p)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  void *__ptr;
  void *__ptr_00;
  long lVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  char cVar6;
  void *pvVar7;
  long lVar8;
  
  __ptr = calloc(0x55924,1);
  __ptr_00 = malloc(4000);
  lVar4 = 0;
  pvVar7 = __ptr;
  do {
    *(void **)((long)__ptr_00 + lVar4 * 8) = pvVar7;
    lVar4 = lVar4 + 1;
    pvVar7 = (void *)((long)pvVar7 + 0x2bd);
  } while (lVar4 != 500);
  if (0 < p->nObjData) {
    uVar3 = 0;
    do {
      piVar5 = p->pObjData;
      if (piVar5 == (int *)0x0) break;
      *(undefined1 *)
       (*(long *)((long)__ptr_00 +
                 (ulong)((uint)p->pPlacement[(ulong)(uint)(piVar5[(ulong)uVar3 + 4] * 2) + 1] * 500
                        >> 0x10) * 8) +
       (ulong)((uint)p->pPlacement[(uint)(piVar5[(ulong)uVar3 + 4] * 2)] * 700 >> 0x10)) = 1;
      uVar3 = piVar5[(ulong)uVar3 + 1] + ((uint)piVar5[uVar3] >> 4) + uVar3 + 5;
    } while ((int)uVar3 < p->nObjData);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_00->pArray = piVar5;
  lVar4 = 0;
  do {
    lVar1 = *(long *)((long)__ptr_00 + lVar4 * 8);
    lVar8 = 0;
    bVar2 = false;
    do {
      while( true ) {
        cVar6 = *(char *)(lVar1 + lVar8);
        if (!bVar2 && cVar6 != '\0') {
          Vec_IntPush(p_00,(int)lVar8);
          Vec_IntPush(p_00,(int)lVar4);
          cVar6 = *(char *)(lVar1 + lVar8);
          bVar2 = true;
        }
        if (cVar6 != '\0' || !bVar2) break;
        Vec_IntPush(p_00,(int)lVar8 + -1);
        Vec_IntPush(p_00,(int)lVar4);
        lVar8 = lVar8 + 1;
        bVar2 = false;
        if (lVar8 == 0x2bd) goto LAB_0068ea7b;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x2bd);
    if (bVar2) {
      __assert_fail("fStart == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                    ,0x68d,"Vec_Int_t *Emb_ManDumpGnuplotPrepare(Emb_Man_t *)");
    }
LAB_0068ea7b:
    lVar4 = lVar4 + 1;
    if (lVar4 == 500) {
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      return p_00;
    }
  } while( true );
}

Assistant:

Vec_Int_t * Emb_ManDumpGnuplotPrepare( Emb_Man_t * p )
{
//    int nRows = 496;
//    int nCols = 710;
    int nRows = 500;
    int nCols = 700;
    Vec_Int_t * vLines;
    Emb_Obj_t * pThis;
    char * pBuffer, ** ppRows;
    int i, k, placeX, placeY;
    int fStart;
    // alloc memory
    pBuffer = ABC_CALLOC( char, nRows * (nCols+1) );
    ppRows  = ABC_ALLOC( char *, nRows );
    for ( i = 0; i < nRows; i++ )
        ppRows[i] = pBuffer + i*(nCols+1);
    // put data into them
    Emb_ManForEachObj( p, pThis, i )
    {
        placeX = p->pPlacement[2*pThis->Value+0] * nCols / (1<<16);
        placeY = p->pPlacement[2*pThis->Value+1] * nRows / (1<<16);
        assert( placeX < nCols && placeY < nRows );
        ppRows[placeY][placeX] = 1;
    }
    // select lines
    vLines = Vec_IntAlloc( 1000 );
    for ( i = 0; i < nRows; i++ )
    {
        fStart = 0;
        for ( k = 0; k <= nCols; k++ )
        {
            if ( ppRows[i][k] && !fStart )
            {
                Vec_IntPush( vLines, k );
                Vec_IntPush( vLines, i );
                fStart = 1;
            }
            if ( !ppRows[i][k] && fStart )
            {
                Vec_IntPush( vLines, k-1 );
                Vec_IntPush( vLines, i );
                fStart = 0;
            }
        }
        assert( fStart == 0 );
    }
    ABC_FREE( pBuffer );
    ABC_FREE( ppRows );
    return vLines;
}